

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledOutputFile.cpp
# Opt level: O2

TileCoord __thiscall Imf_3_4::TiledOutputFile::Data::nextTileCoord(Data *this,TileCoord *a)

{
  ulong uVar1;
  LevelMode LVar2;
  ulong uVar3;
  ArgExc *this_00;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  TileCoord TVar8;
  
  uVar1._0_4_ = a->dx;
  uVar1._4_4_ = a->dy;
  uVar6 = *(ulong *)&a->lx;
  uVar4 = uVar1 >> 0x20;
  iVar5 = (int)uVar6;
  if (this->lineOrder == DECREASING_Y) {
    uVar3 = (ulong)((undefined4)uVar1 + 1);
    if (this->numXTiles[iVar5] <= (int)((undefined4)uVar1 + 1)) {
      uVar4 = (ulong)(uVar1._4_4_ - 1);
      uVar3 = 0;
      if (uVar1._4_4_ == 0 || (long)uVar1 < 0) {
        LVar2 = (this->tileDesc).mode;
        if (LVar2 < RIPMAP_LEVELS) {
          uVar6 = (uVar6 & 0xffffffff00000000 | (ulong)(iVar5 + 1)) + 0x100000000;
        }
        else if (LVar2 == RIPMAP_LEVELS) {
          uVar1 = uVar6 + 1;
          uVar7 = uVar6 & 0xffffffff00000000;
          uVar6 = uVar7 + 0x100000000;
          if ((int)uVar1 < this->numXLevels) {
            uVar6 = uVar1 & 0xffffffff | uVar7;
          }
        }
        else if (LVar2 == NUM_LEVELMODES) {
          this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_4::ArgExc::ArgExc(this_00,"Invalid tile description");
          goto LAB_001a2fc7;
        }
        if ((int)(uVar6 >> 0x20) < this->numYLevels) {
          uVar4 = (ulong)(this->numYTiles[(long)uVar6 >> 0x20] - 1);
        }
      }
    }
  }
  else {
    uVar3 = uVar1;
    if ((this->lineOrder == INCREASING_Y) &&
       (uVar3 = (ulong)((undefined4)uVar1 + 1),
       this->numXTiles[iVar5] <= (int)((undefined4)uVar1 + 1))) {
      uVar4 = (ulong)(uVar1._4_4_ + 1);
      uVar3 = 0;
      if (this->numYTiles[(long)uVar6 >> 0x20] <= (int)(uVar1._4_4_ + 1)) {
        LVar2 = (this->tileDesc).mode;
        uVar3 = 0;
        if (LVar2 < RIPMAP_LEVELS) {
          uVar6 = (uVar6 & 0xffffffff00000000 | (ulong)(iVar5 + 1)) + 0x100000000;
        }
        else {
          if (LVar2 != RIPMAP_LEVELS) {
            uVar4 = 0;
            if (LVar2 == NUM_LEVELMODES) {
              this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
              Iex_3_4::ArgExc::ArgExc(this_00,"Invalid tile description");
LAB_001a2fc7:
              __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
            }
            goto LAB_001a30a6;
          }
          uVar1 = uVar6 + 1;
          uVar4 = uVar6 & 0xffffffff00000000;
          uVar6 = uVar4 + 0x100000000;
          if ((int)uVar1 < this->numXLevels) {
            uVar6 = uVar1 & 0xffffffff | uVar4;
          }
        }
        uVar4 = 0;
      }
    }
  }
LAB_001a30a6:
  TVar8._0_8_ = uVar3 & 0xffffffff | uVar4 << 0x20;
  TVar8.lx = (int)uVar6;
  TVar8.ly = (int)(uVar6 >> 0x20);
  return TVar8;
}

Assistant:

TileCoord
TiledOutputFile::Data::nextTileCoord (const TileCoord& a)
{
    TileCoord b = a;

    if (lineOrder == INCREASING_Y)
    {
        b.dx++;

        if (b.dx >= numXTiles[b.lx])
        {
            b.dx = 0;
            b.dy++;

            if (b.dy >= numYTiles[b.ly])
            {
                //
                // the next tile is in the next level
                //

                b.dy = 0;

                switch (tileDesc.mode)
                {
                    case ONE_LEVEL:
                    case MIPMAP_LEVELS:

                        b.lx++;
                        b.ly++;
                        break;

                    case RIPMAP_LEVELS:

                        b.lx++;

                        if (b.lx >= numXLevels)
                        {
                            b.lx = 0;
                            b.ly++;

#ifdef DEBUG
                            assert (b.ly <= numYLevels);
#endif
                        }
                        break;
                    case NUM_LEVELMODES:
                        throw (
                            IEX_NAMESPACE::ArgExc ("Invalid tile description"));
                }
            }
        }
    }
    else if (lineOrder == DECREASING_Y)
    {
        b.dx++;

        if (b.dx >= numXTiles[b.lx])
        {
            b.dx = 0;
            b.dy--;

            if (b.dy < 0)
            {
                //
                // the next tile is in the next level
                //

                switch (tileDesc.mode)
                {
                    case ONE_LEVEL:
                    case MIPMAP_LEVELS:

                        b.lx++;
                        b.ly++;
                        break;

                    case RIPMAP_LEVELS:

                        b.lx++;

                        if (b.lx >= numXLevels)
                        {
                            b.lx = 0;
                            b.ly++;

#ifdef DEBUG
                            assert (b.ly <= numYLevels);
#endif
                        }
                        break;
                    case NUM_LEVELMODES:
                        throw (
                            IEX_NAMESPACE::ArgExc ("Invalid tile description"));
                }

                if (b.ly < numYLevels) b.dy = numYTiles[b.ly] - 1;
            }
        }
    }

    return b;
}